

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parents.h
# Opt level: O2

void __thiscall wasm::Parents::Parents(Parents *this,Expression *expr)

{
  Expression *local_20;
  Expression *expr_local;
  
  local_20 = expr;
  Inner::Inner(&this->inner);
  Walker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>::walk
            ((Walker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
              *)this,&local_20);
  return;
}

Assistant:

Parents(Expression* expr) { inner.walk(expr); }